

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcNtk.c
# Opt level: O1

void Wlc_NtkPrintDistrib(Wlc_Ntk_t *p,int fTwoSides,int fVerbose)

{
  ushort uVar1;
  Wlc_Obj_t *pWVar2;
  Vec_Wrd_t *p_00;
  Vec_Wrd_t *p_01;
  void *pvVar3;
  int iVar4;
  undefined8 *__ptr;
  void *pvVar5;
  Vec_Ptr_t *vTypes;
  void **__s;
  Vec_Ptr_t *vOccurs;
  void **__s_00;
  undefined8 *puVar6;
  char *pcVar7;
  anon_union_8_2_cb25d913_for_Wlc_Obj_t__10 *paVar8;
  int iVar9;
  int iVar10;
  ulong uVar11;
  uint uVar12;
  word Entry;
  ulong uVar13;
  ushort uVar14;
  int iVar15;
  char *pcVar16;
  int iVar17;
  uint uVar18;
  int iVar19;
  Wlc_Obj_t *pWVar20;
  Wlc_Obj_t *pWVar21;
  ulong uVar22;
  long lVar23;
  ulong uVar24;
  bool bVar25;
  bool bVar26;
  double dVar27;
  int nObjs [2] [60];
  uint local_218 [60];
  uint auStack_128 [62];
  
  memset(local_218,0,0x1e0);
  __ptr = (undefined8 *)malloc(0x10);
  *__ptr = 0x3c;
  pvVar5 = malloc(0xf0);
  __ptr[1] = pvVar5;
  *(undefined4 *)((long)__ptr + 4) = 0x3c;
  if (pvVar5 != (void *)0x0) {
    memset(pvVar5,0,0xf0);
  }
  bVar25 = (p->vPos).nSize != 2;
  bVar26 = fTwoSides == 0;
  if (!bVar26 && !bVar25) {
    Wlc_NtkCollectStats(p,(int (*) [60])local_218);
  }
  vTypes = (Vec_Ptr_t *)malloc(0x10);
  vTypes->nCap = 0x3c;
  vTypes->nSize = 0;
  __s = (void **)malloc(0x1e0);
  vTypes->pArray = __s;
  vTypes->nSize = 0x3c;
  lVar23 = 0;
  memset(__s,0,0x1e0);
  vOccurs = (Vec_Ptr_t *)malloc(0x10);
  vOccurs->nCap = 0x3c;
  vOccurs->nSize = 0;
  __s_00 = (void **)malloc(0x1e0);
  vOccurs->pArray = __s_00;
  vOccurs->nSize = 0x3c;
  memset(__s_00,0,0x1e0);
  do {
    puVar6 = (undefined8 *)malloc(0x10);
    *puVar6 = 0x10;
    pvVar5 = malloc(0x80);
    puVar6[1] = pvVar5;
    __s[lVar23] = puVar6;
    lVar23 = lVar23 + 1;
  } while (lVar23 != 0x3c);
  lVar23 = 0;
  do {
    puVar6 = (undefined8 *)malloc(0x10);
    *puVar6 = 0x10;
    pvVar5 = malloc(0x80);
    puVar6[1] = pvVar5;
    __s_00[lVar23] = puVar6;
    lVar23 = lVar23 + 1;
  } while (lVar23 != 0x3c);
  if (p->iObj < 2) {
    iVar15 = 0;
    pWVar21 = (Wlc_Obj_t *)0x0;
  }
  else {
    uVar22 = 1;
    iVar15 = 0;
    Entry = 0;
    pWVar20 = (Wlc_Obj_t *)0x0;
    do {
      if ((long)p->nObjsAlloc <= (long)uVar22) goto LAB_0036c8b4;
      pWVar2 = p->pObjs;
      iVar4 = pWVar2[uVar22].End - pWVar2[uVar22].Beg;
      iVar10 = -iVar4;
      if (0 < iVar4) {
        iVar10 = iVar4;
      }
      if (iVar10 * 2 - 0x1ffffeU < 0xffe00000) {
        printf("Object %6d has range %d, which is reduced to %d in the statistics.\n",
               uVar22 & 0xffffffff,(ulong)(iVar10 + 1U),(ulong)(iVar10 + 1U & 0xfffff));
      }
      pWVar2 = pWVar2 + uVar22;
      iVar10 = pWVar2->Beg;
      pWVar21 = pWVar20;
      if (pWVar20 == (Wlc_Obj_t *)0x0) {
        pWVar21 = pWVar2;
      }
      if (iVar10 == 0) {
        pWVar21 = pWVar20;
      }
      uVar1 = *(ushort *)pWVar2;
      if ((uVar1 & 0x3d) == 1) {
LAB_0036a9ad:
        iVar9 = pWVar2->End - iVar10;
        iVar4 = -iVar9;
        if (0 < iVar9) {
          iVar4 = iVar9;
        }
        Entry = (word)((uVar1 >> 6 & 1) + iVar4 * 2 + 2);
      }
      else {
        uVar14 = uVar1 & 0x3f;
        if (uVar14 < 0x36) {
          if ((0x24000007408080U >> uVar14 & 1) == 0) {
            if ((0x800040UL >> uVar14 & 1) != 0) goto LAB_0036a9ad;
            goto LAB_0036ab48;
          }
          iVar9 = pWVar2->End - iVar10;
          iVar4 = -iVar9;
          if (0 < iVar9) {
            iVar4 = iVar9;
          }
          paVar8 = &pWVar2->field_10;
          if (((uVar1 & 0x2f) == 6) || (2 < pWVar2->nFanins)) {
LAB_0036aa0e:
            paVar8 = (anon_union_8_2_cb25d913_for_Wlc_Obj_t__10 *)(pWVar2->field_10).pFanins[0];
          }
        }
        else {
LAB_0036ab48:
          uVar12 = pWVar2->nFanins;
          if (uVar12 != 1) {
            if (uVar12 == 0) {
              pcVar7 = Wlc_ObjName(p,(int)uVar22);
              printf("Object %d with name \"%s\" has type 0. Looks like it was declared by not defined...\n"
                     ,uVar22 & 0xffffffff,pcVar7);
            }
            else {
              if ((int)uVar12 < 2) {
                __assert_fail("Wlc_ObjFaninNum(pObj) >= 2",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/wlc/wlcNtk.c"
                              ,0x22d,"void Wlc_NtkPrintDistrib(Wlc_Ntk_t *, int, int)");
              }
              iVar9 = pWVar2->End - iVar10;
              iVar4 = -iVar9;
              if (0 < iVar9) {
                iVar4 = iVar9;
              }
              uVar14 = uVar1 & 0x2f;
              paVar8 = &pWVar2->field_10;
              if (uVar14 == 6 || uVar12 != 2) {
                paVar8 = (anon_union_8_2_cb25d913_for_Wlc_Obj_t__10 *)paVar8->pFanins[0];
              }
              if (paVar8->Fanins[0] == 0) {
                uVar13 = 0;
              }
              else {
                paVar8 = &pWVar2->field_10;
                if (uVar14 == 6 || uVar12 != 2) {
                  paVar8 = (anon_union_8_2_cb25d913_for_Wlc_Obj_t__10 *)paVar8->pFanins[0];
                }
                lVar23 = (long)paVar8->Fanins[0];
                if ((lVar23 < 1) || (p->nObjsAlloc <= paVar8->Fanins[0])) goto LAB_0036c8b4;
                pWVar20 = p->pObjs;
                iVar17 = pWVar20[lVar23].End - pWVar20[lVar23].Beg;
                iVar9 = -iVar17;
                if (0 < iVar17) {
                  iVar9 = iVar17;
                }
                uVar13 = (ulong)((*(uint *)(pWVar20 + lVar23) >> 6 & 1) + iVar9 * 2 + 2) << 0x15;
              }
              paVar8 = &pWVar2->field_10;
              if (uVar14 == 6 || uVar12 != 2) {
                paVar8 = (anon_union_8_2_cb25d913_for_Wlc_Obj_t__10 *)paVar8->pFanins[0];
              }
              if (paVar8->Fanins[1] == 0) {
                uVar11 = 0;
              }
              else {
                paVar8 = &pWVar2->field_10;
                if (uVar14 == 6 || uVar12 != 2) {
                  paVar8 = (anon_union_8_2_cb25d913_for_Wlc_Obj_t__10 *)paVar8->pFanins[0];
                }
                lVar23 = (long)paVar8->Fanins[1];
                if ((lVar23 < 1) || (p->nObjsAlloc <= paVar8->Fanins[1])) goto LAB_0036c8b4;
                pWVar20 = p->pObjs;
                iVar17 = pWVar20[lVar23].End - pWVar20[lVar23].Beg;
                iVar9 = -iVar17;
                if (0 < iVar17) {
                  iVar9 = iVar17;
                }
                uVar11 = (ulong)((*(uint *)(pWVar20 + lVar23) >> 6 & 1) + iVar9 * 2 + 2) << 0x2a;
              }
              Entry = (ulong)((uVar1 >> 6 & 1) + iVar4 * 2 + 2) | uVar13 | uVar11;
            }
            goto LAB_0036aa68;
          }
          iVar9 = pWVar2->End - iVar10;
          iVar4 = -iVar9;
          if (0 < iVar9) {
            iVar4 = iVar9;
          }
          paVar8 = &pWVar2->field_10;
          if ((uVar1 & 0x2f) == 6) goto LAB_0036aa0e;
        }
        lVar23 = (long)paVar8->Fanins[0];
        if ((lVar23 < 1) || (p->nObjsAlloc <= paVar8->Fanins[0])) goto LAB_0036c8b4;
        pWVar20 = p->pObjs;
        iVar17 = pWVar20[lVar23].End - pWVar20[lVar23].Beg;
        iVar9 = -iVar17;
        if (0 < iVar17) {
          iVar9 = iVar17;
        }
        Entry = (ulong)((uVar1 >> 6 & 1) + iVar4 * 2 + 2) |
                (ulong)((*(uint *)(pWVar20 + lVar23) >> 6 & 1) + iVar9 * 2 + 2) << 0x15;
      }
LAB_0036aa68:
      if (0x3b < (ushort)(*(ushort *)pWVar2 & 0x3f)) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      uVar13 = (ulong)((*(ushort *)pWVar2 & 0x3f) << 3);
      p_00 = *(Vec_Wrd_t **)((long)__s + uVar13);
      p_01 = *(Vec_Wrd_t **)((long)__s_00 + uVar13);
      if (0 < (long)p_00->nSize) {
        lVar23 = 0;
        do {
          if (p_00->pArray[lVar23] == Entry) {
            if (p_01->nSize <= (int)lVar23) {
              __assert_fail("i >= 0 && i < p->nSize",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecWrd.h"
                            ,0x1e0,"word Vec_WrdAddToEntry(Vec_Wrd_t *, int, word)");
            }
            p_01->pArray[lVar23] = p_01->pArray[lVar23] + 1;
            goto LAB_0036aadc;
          }
          lVar23 = lVar23 + 1;
        } while (p_00->nSize != lVar23);
      }
      Vec_WrdPush(p_00,Entry);
      Vec_WrdPush(p_01,1);
LAB_0036aadc:
      uVar1 = *(ushort *)pWVar2;
      switch(uVar1 & 0x3f) {
      case 8:
        if (*(int *)((long)__ptr + 4) < 9) {
LAB_0036c911:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                        ,0x1dc,"int Vec_IntAddToEntry(Vec_Int_t *, int, int)");
        }
        iVar9 = pWVar2->End - pWVar2->Beg;
        iVar4 = -iVar9;
        if (0 < iVar9) {
          iVar4 = iVar9;
        }
        *(int *)(__ptr[1] + 0x20) =
             *(int *)(__ptr[1] + 0x20) + (pWVar2->nFanins - 2) * (iVar4 * 3 + 3);
        break;
      case 9:
        paVar8 = &pWVar2->field_10;
        if (((uVar1 & 0x2f) == 6) || (2 < pWVar2->nFanins)) {
          paVar8 = (anon_union_8_2_cb25d913_for_Wlc_Obj_t__10 *)paVar8->pFanins[0];
        }
        lVar23 = (long)paVar8->Fanins[0];
        if ((lVar23 < 1) || (p->nObjsAlloc <= paVar8->Fanins[0])) goto LAB_0036c8b4;
        if (*(int *)((long)__ptr + 4) < 10) goto LAB_0036c911;
        uVar18 = pWVar2->End - pWVar2->Beg;
        uVar12 = -uVar18;
        if (0 < (int)uVar18) {
          uVar12 = uVar18;
        }
        uVar18 = 0x1f;
        if (uVar12 != 0) {
          for (; uVar12 >> uVar18 == 0; uVar18 = uVar18 - 1) {
          }
        }
        iVar4 = 1;
        if (pWVar2->End != pWVar2->Beg) {
          iVar4 = (uVar18 ^ 0xffffffe0) + 0x21;
        }
        iVar17 = p->pObjs[lVar23].End - p->pObjs[lVar23].Beg;
        iVar9 = -iVar17;
        if (0 < iVar17) {
          iVar9 = iVar17;
        }
        iVar17 = iVar9 + 1;
        if (iVar4 <= iVar9 + 1) {
          iVar17 = iVar4;
        }
        *(int *)(__ptr[1] + 0x24) = *(int *)(__ptr[1] + 0x24) + iVar17 * 3;
        break;
      case 10:
        uVar18 = pWVar2->End - pWVar2->Beg;
        uVar12 = -uVar18;
        if (0 < (int)uVar18) {
          uVar12 = uVar18;
        }
        paVar8 = &pWVar2->field_10;
        if (((uVar1 & 0x2f) == 6) || (2 < pWVar2->nFanins)) {
          paVar8 = (anon_union_8_2_cb25d913_for_Wlc_Obj_t__10 *)paVar8->pFanins[0];
        }
        lVar23 = (long)paVar8->Fanins[0];
        if ((lVar23 < 1) || (p->nObjsAlloc <= paVar8->Fanins[0])) goto LAB_0036c8b4;
        if (*(int *)((long)__ptr + 4) < 0xb) goto LAB_0036c911;
        uVar18 = 0x1f;
        if (uVar12 != 0) {
          for (; uVar12 >> uVar18 == 0; uVar18 = uVar18 - 1) {
          }
        }
        iVar4 = 1;
        if (pWVar2->End != pWVar2->Beg) {
          iVar4 = (uVar18 ^ 0xffffffe0) + 0x21;
        }
        iVar17 = p->pObjs[lVar23].End - p->pObjs[lVar23].Beg;
        iVar9 = -iVar17;
        if (0 < iVar17) {
          iVar9 = iVar17;
        }
        iVar17 = iVar9 + 1;
        if (iVar4 <= iVar9 + 1) {
          iVar17 = iVar4;
        }
        *(int *)(__ptr[1] + 0x28) = *(int *)(__ptr[1] + 0x28) + (uVar12 * 3 + 3) * iVar17;
        break;
      case 0xb:
        uVar18 = pWVar2->End - pWVar2->Beg;
        uVar12 = -uVar18;
        if (0 < (int)uVar18) {
          uVar12 = uVar18;
        }
        paVar8 = &pWVar2->field_10;
        if (((uVar1 & 0x2f) == 6) || (2 < pWVar2->nFanins)) {
          paVar8 = (anon_union_8_2_cb25d913_for_Wlc_Obj_t__10 *)paVar8->pFanins[0];
        }
        lVar23 = (long)paVar8->Fanins[0];
        if ((lVar23 < 1) || (p->nObjsAlloc <= paVar8->Fanins[0])) goto LAB_0036c8b4;
        if (*(int *)((long)__ptr + 4) < 0xc) goto LAB_0036c911;
        uVar18 = 0x1f;
        if (uVar12 != 0) {
          for (; uVar12 >> uVar18 == 0; uVar18 = uVar18 - 1) {
          }
        }
        iVar4 = 1;
        if (pWVar2->End != pWVar2->Beg) {
          iVar4 = (uVar18 ^ 0xffffffe0) + 0x21;
        }
        iVar17 = p->pObjs[lVar23].End - p->pObjs[lVar23].Beg;
        iVar9 = -iVar17;
        if (0 < iVar17) {
          iVar9 = iVar17;
        }
        iVar17 = iVar9 + 1;
        if (iVar4 <= iVar9 + 1) {
          iVar17 = iVar4;
        }
        *(int *)(__ptr[1] + 0x2c) = *(int *)(__ptr[1] + 0x2c) + (uVar12 * 3 + 3) * iVar17;
        break;
      case 0xc:
        uVar18 = pWVar2->End - pWVar2->Beg;
        uVar12 = -uVar18;
        if (0 < (int)uVar18) {
          uVar12 = uVar18;
        }
        paVar8 = &pWVar2->field_10;
        if (((uVar1 & 0x2f) == 6) || (2 < pWVar2->nFanins)) {
          paVar8 = (anon_union_8_2_cb25d913_for_Wlc_Obj_t__10 *)paVar8->pFanins[0];
        }
        lVar23 = (long)paVar8->Fanins[0];
        if ((lVar23 < 1) || (p->nObjsAlloc <= paVar8->Fanins[0])) goto LAB_0036c8b4;
        if (*(int *)((long)__ptr + 4) < 0xd) goto LAB_0036c911;
        uVar18 = 0x1f;
        if (uVar12 != 0) {
          for (; uVar12 >> uVar18 == 0; uVar18 = uVar18 - 1) {
          }
        }
        iVar4 = 1;
        if (pWVar2->End != pWVar2->Beg) {
          iVar4 = (uVar18 ^ 0xffffffe0) + 0x21;
        }
        iVar17 = p->pObjs[lVar23].End - p->pObjs[lVar23].Beg;
        iVar9 = -iVar17;
        if (0 < iVar17) {
          iVar9 = iVar17;
        }
        iVar17 = iVar9 + 1;
        if (iVar4 <= iVar9 + 1) {
          iVar17 = iVar4;
        }
        *(int *)(__ptr[1] + 0x30) = *(int *)(__ptr[1] + 0x30) + (uVar12 * 3 + 3) * iVar17;
        break;
      case 0xd:
        uVar18 = pWVar2->End - pWVar2->Beg;
        uVar12 = -uVar18;
        if (0 < (int)uVar18) {
          uVar12 = uVar18;
        }
        paVar8 = &pWVar2->field_10;
        if (((uVar1 & 0x2f) == 6) || (2 < pWVar2->nFanins)) {
          paVar8 = (anon_union_8_2_cb25d913_for_Wlc_Obj_t__10 *)paVar8->pFanins[0];
        }
        lVar23 = (long)paVar8->Fanins[0];
        if ((lVar23 < 1) || (p->nObjsAlloc <= paVar8->Fanins[0])) goto LAB_0036c8b4;
        if (*(int *)((long)__ptr + 4) < 0xe) goto LAB_0036c911;
        uVar18 = 0x1f;
        if (uVar12 != 0) {
          for (; uVar12 >> uVar18 == 0; uVar18 = uVar18 - 1) {
          }
        }
        iVar4 = 1;
        if (pWVar2->End != pWVar2->Beg) {
          iVar4 = (uVar18 ^ 0xffffffe0) + 0x21;
        }
        iVar17 = p->pObjs[lVar23].End - p->pObjs[lVar23].Beg;
        iVar9 = -iVar17;
        if (0 < iVar17) {
          iVar9 = iVar17;
        }
        iVar17 = iVar9 + 1;
        if (iVar4 <= iVar9 + 1) {
          iVar17 = iVar4;
        }
        *(int *)(__ptr[1] + 0x34) = *(int *)(__ptr[1] + 0x34) + (uVar12 * 3 + 3) * iVar17;
        break;
      case 0xe:
        uVar18 = pWVar2->End - pWVar2->Beg;
        uVar12 = -uVar18;
        if (0 < (int)uVar18) {
          uVar12 = uVar18;
        }
        paVar8 = &pWVar2->field_10;
        if (((uVar1 & 0x2f) == 6) || (2 < pWVar2->nFanins)) {
          paVar8 = (anon_union_8_2_cb25d913_for_Wlc_Obj_t__10 *)paVar8->pFanins[0];
        }
        lVar23 = (long)paVar8->Fanins[0];
        if ((lVar23 < 1) || (p->nObjsAlloc <= paVar8->Fanins[0])) goto LAB_0036c8b4;
        if (*(int *)((long)__ptr + 4) < 0xf) goto LAB_0036c911;
        uVar18 = 0x1f;
        if (uVar12 != 0) {
          for (; uVar12 >> uVar18 == 0; uVar18 = uVar18 - 1) {
          }
        }
        iVar4 = 1;
        if (pWVar2->End != pWVar2->Beg) {
          iVar4 = (uVar18 ^ 0xffffffe0) + 0x21;
        }
        iVar17 = p->pObjs[lVar23].End - p->pObjs[lVar23].Beg;
        iVar9 = -iVar17;
        if (0 < iVar17) {
          iVar9 = iVar17;
        }
        iVar17 = iVar9 + 1;
        if (iVar4 <= iVar9 + 1) {
          iVar17 = iVar4;
        }
        *(int *)(__ptr[1] + 0x38) = *(int *)(__ptr[1] + 0x38) + (uVar12 * 3 + 3) * iVar17;
        break;
      case 0xf:
        if (*(int *)((long)__ptr + 4) < 0x10) goto LAB_0036c911;
        break;
      case 0x10:
        paVar8 = &pWVar2->field_10;
        if (((uVar1 & 0x2f) == 6) || (2 < pWVar2->nFanins)) {
          paVar8 = (anon_union_8_2_cb25d913_for_Wlc_Obj_t__10 *)paVar8->pFanins[0];
        }
        lVar23 = (long)paVar8->Fanins[0];
        if ((lVar23 < 1) || (p->nObjsAlloc <= paVar8->Fanins[0])) goto LAB_0036c8b4;
        if (*(int *)((long)__ptr + 4) < 0x11) goto LAB_0036c911;
        iVar9 = p->pObjs[lVar23].End - p->pObjs[lVar23].Beg;
        iVar4 = -iVar9;
        if (0 < iVar9) {
          iVar4 = iVar9;
        }
        *(int *)(__ptr[1] + 0x40) = iVar4 + *(int *)(__ptr[1] + 0x40) + 1;
        break;
      case 0x11:
        paVar8 = &pWVar2->field_10;
        if (((uVar1 & 0x2f) == 6) || (2 < pWVar2->nFanins)) {
          paVar8 = (anon_union_8_2_cb25d913_for_Wlc_Obj_t__10 *)paVar8->pFanins[0];
        }
        lVar23 = (long)paVar8->Fanins[0];
        if ((lVar23 < 1) || (p->nObjsAlloc <= paVar8->Fanins[0])) goto LAB_0036c8b4;
        if (*(int *)((long)__ptr + 4) < 0x12) goto LAB_0036c911;
        iVar9 = p->pObjs[lVar23].End - p->pObjs[lVar23].Beg;
        iVar4 = -iVar9;
        if (0 < iVar9) {
          iVar4 = iVar9;
        }
        *(int *)(__ptr[1] + 0x44) = iVar4 + *(int *)(__ptr[1] + 0x44) + 1;
        break;
      case 0x12:
        paVar8 = &pWVar2->field_10;
        if (((uVar1 & 0x2f) == 6) || (2 < pWVar2->nFanins)) {
          paVar8 = (anon_union_8_2_cb25d913_for_Wlc_Obj_t__10 *)paVar8->pFanins[0];
        }
        lVar23 = (long)paVar8->Fanins[0];
        if ((lVar23 < 1) || (p->nObjsAlloc <= paVar8->Fanins[0])) goto LAB_0036c8b4;
        if (*(int *)((long)__ptr + 4) < 0x13) goto LAB_0036c911;
        iVar9 = p->pObjs[lVar23].End - p->pObjs[lVar23].Beg;
        iVar4 = -iVar9;
        if (0 < iVar9) {
          iVar4 = iVar9;
        }
        *(int *)(__ptr[1] + 0x48) = iVar4 * 3 + *(int *)(__ptr[1] + 0x48) + 3;
        break;
      case 0x13:
        paVar8 = &pWVar2->field_10;
        if (((uVar1 & 0x2f) == 6) || (2 < pWVar2->nFanins)) {
          paVar8 = (anon_union_8_2_cb25d913_for_Wlc_Obj_t__10 *)paVar8->pFanins[0];
        }
        lVar23 = (long)paVar8->Fanins[0];
        if ((lVar23 < 1) || (p->nObjsAlloc <= paVar8->Fanins[0])) goto LAB_0036c8b4;
        if (*(int *)((long)__ptr + 4) < 0x14) goto LAB_0036c911;
        iVar9 = p->pObjs[lVar23].End - p->pObjs[lVar23].Beg;
        iVar4 = -iVar9;
        if (0 < iVar9) {
          iVar4 = iVar9;
        }
        *(int *)(__ptr[1] + 0x4c) = iVar4 + *(int *)(__ptr[1] + 0x4c) + 1;
        break;
      case 0x14:
        paVar8 = &pWVar2->field_10;
        if (((uVar1 & 0x2f) == 6) || (2 < pWVar2->nFanins)) {
          paVar8 = (anon_union_8_2_cb25d913_for_Wlc_Obj_t__10 *)paVar8->pFanins[0];
        }
        lVar23 = (long)paVar8->Fanins[0];
        if ((lVar23 < 1) || (p->nObjsAlloc <= paVar8->Fanins[0])) goto LAB_0036c8b4;
        if (*(int *)((long)__ptr + 4) < 0x15) goto LAB_0036c911;
        iVar9 = p->pObjs[lVar23].End - p->pObjs[lVar23].Beg;
        iVar4 = -iVar9;
        if (0 < iVar9) {
          iVar4 = iVar9;
        }
        *(int *)(__ptr[1] + 0x50) = iVar4 + *(int *)(__ptr[1] + 0x50) + 1;
        break;
      case 0x15:
        paVar8 = &pWVar2->field_10;
        if (((uVar1 & 0x2f) == 6) || (2 < pWVar2->nFanins)) {
          paVar8 = (anon_union_8_2_cb25d913_for_Wlc_Obj_t__10 *)paVar8->pFanins[0];
        }
        lVar23 = (long)paVar8->Fanins[0];
        if ((lVar23 < 1) || (p->nObjsAlloc <= paVar8->Fanins[0])) goto LAB_0036c8b4;
        if (*(int *)((long)__ptr + 4) < 0x16) goto LAB_0036c911;
        iVar9 = p->pObjs[lVar23].End - p->pObjs[lVar23].Beg;
        iVar4 = -iVar9;
        if (0 < iVar9) {
          iVar4 = iVar9;
        }
        *(int *)(__ptr[1] + 0x54) = iVar4 * 3 + *(int *)(__ptr[1] + 0x54) + 3;
        break;
      case 0x16:
        if (*(int *)((long)__ptr + 4) < 0x17) goto LAB_0036c911;
        break;
      case 0x17:
        if (*(int *)((long)__ptr + 4) < 0x18) goto LAB_0036c911;
        break;
      case 0x18:
        if (*(int *)((long)__ptr + 4) < 0x19) goto LAB_0036c911;
        break;
      case 0x19:
        if (*(int *)((long)__ptr + 4) < 0x1a) goto LAB_0036c911;
        break;
      case 0x1a:
        paVar8 = &pWVar2->field_10;
        if (((uVar1 & 0x2f) == 6) || (2 < pWVar2->nFanins)) {
          paVar8 = (anon_union_8_2_cb25d913_for_Wlc_Obj_t__10 *)paVar8->pFanins[0];
        }
        lVar23 = (long)paVar8->Fanins[0];
        if ((lVar23 < 1) || (p->nObjsAlloc <= paVar8->Fanins[0])) goto LAB_0036c8b4;
        if (*(int *)((long)__ptr + 4) < 0x1b) goto LAB_0036c911;
        iVar9 = p->pObjs[lVar23].End - p->pObjs[lVar23].Beg;
        iVar4 = -iVar9;
        if (0 < iVar9) {
          iVar4 = iVar9;
        }
        *(int *)(__ptr[1] + 0x68) = *(int *)(__ptr[1] + 0x68) + iVar4;
        break;
      case 0x1b:
        paVar8 = &pWVar2->field_10;
        if ((uVar1 & 0x2f) == 6 || 2 < pWVar2->nFanins) {
          paVar8 = (anon_union_8_2_cb25d913_for_Wlc_Obj_t__10 *)paVar8->pFanins[0];
        }
        lVar23 = (long)paVar8->Fanins[0];
        if ((lVar23 < 1) || (p->nObjsAlloc <= paVar8->Fanins[0])) {
LAB_0036c8b4:
          __assert_fail("Id > 0 && Id < p->nObjsAlloc",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/wlc/wlc.h"
                        ,0x11a,"Wlc_Obj_t *Wlc_NtkObj(Wlc_Ntk_t *, int)");
        }
        pWVar20 = p->pObjs;
        iVar9 = pWVar20[lVar23].End - pWVar20[lVar23].Beg;
        iVar4 = -iVar9;
        if (0 < iVar9) {
          iVar4 = iVar9;
        }
        paVar8 = &pWVar2->field_10;
        if ((uVar1 & 0x2f) == 6 || 2 < pWVar2->nFanins) {
          paVar8 = (anon_union_8_2_cb25d913_for_Wlc_Obj_t__10 *)paVar8->pFanins[0];
        }
        lVar23 = (long)paVar8->Fanins[1];
        if ((lVar23 < 1) || (p->nObjsAlloc <= paVar8->Fanins[1])) goto LAB_0036c8b4;
        if (*(int *)((long)__ptr + 4) < 0x1c) goto LAB_0036c911;
        iVar17 = pWVar20[lVar23].End - pWVar20[lVar23].Beg;
        iVar9 = -iVar17;
        if (0 < iVar17) {
          iVar9 = iVar17;
        }
        *(int *)(__ptr[1] + 0x6c) = *(int *)(__ptr[1] + 0x6c) + iVar4 + iVar9 + 1;
        break;
      case 0x1c:
        paVar8 = &pWVar2->field_10;
        if ((uVar1 & 0x2f) == 6 || 2 < pWVar2->nFanins) {
          paVar8 = (anon_union_8_2_cb25d913_for_Wlc_Obj_t__10 *)paVar8->pFanins[0];
        }
        lVar23 = (long)paVar8->Fanins[0];
        if ((lVar23 < 1) || (p->nObjsAlloc <= paVar8->Fanins[0])) goto LAB_0036c8b4;
        pWVar20 = p->pObjs;
        iVar9 = pWVar20[lVar23].End - pWVar20[lVar23].Beg;
        iVar4 = -iVar9;
        if (0 < iVar9) {
          iVar4 = iVar9;
        }
        paVar8 = &pWVar2->field_10;
        if ((uVar1 & 0x2f) == 6 || 2 < pWVar2->nFanins) {
          paVar8 = (anon_union_8_2_cb25d913_for_Wlc_Obj_t__10 *)paVar8->pFanins[0];
        }
        lVar23 = (long)paVar8->Fanins[1];
        if ((lVar23 < 1) || (p->nObjsAlloc <= paVar8->Fanins[1])) goto LAB_0036c8b4;
        if (*(int *)((long)__ptr + 4) < 0x1d) goto LAB_0036c911;
        iVar17 = pWVar20[lVar23].End - pWVar20[lVar23].Beg;
        iVar9 = -iVar17;
        if (0 < iVar17) {
          iVar9 = iVar17;
        }
        *(int *)(__ptr[1] + 0x70) = *(int *)(__ptr[1] + 0x70) + iVar4 + iVar9 + 1;
        break;
      case 0x1d:
        paVar8 = &pWVar2->field_10;
        if ((uVar1 & 0x2f) == 6 || 2 < pWVar2->nFanins) {
          paVar8 = (anon_union_8_2_cb25d913_for_Wlc_Obj_t__10 *)paVar8->pFanins[0];
        }
        lVar23 = (long)paVar8->Fanins[0];
        if ((lVar23 < 1) || (p->nObjsAlloc <= paVar8->Fanins[0])) goto LAB_0036c8b4;
        pWVar20 = p->pObjs;
        iVar9 = pWVar20[lVar23].End - pWVar20[lVar23].Beg;
        iVar4 = -iVar9;
        if (0 < iVar9) {
          iVar4 = iVar9;
        }
        paVar8 = &pWVar2->field_10;
        if ((uVar1 & 0x2f) == 6 || 2 < pWVar2->nFanins) {
          paVar8 = (anon_union_8_2_cb25d913_for_Wlc_Obj_t__10 *)paVar8->pFanins[0];
        }
        lVar23 = (long)paVar8->Fanins[1];
        if ((lVar23 < 1) || (p->nObjsAlloc <= paVar8->Fanins[1])) goto LAB_0036c8b4;
        if (*(int *)((long)__ptr + 4) < 0x1e) goto LAB_0036c911;
        iVar17 = pWVar20[lVar23].End - pWVar20[lVar23].Beg;
        iVar9 = -iVar17;
        if (0 < iVar17) {
          iVar9 = iVar17;
        }
        *(int *)(__ptr[1] + 0x74) = *(int *)(__ptr[1] + 0x74) + iVar4 + iVar9 + 1;
        break;
      case 0x1e:
        paVar8 = &pWVar2->field_10;
        if ((uVar1 & 0x2f) == 6 || 2 < pWVar2->nFanins) {
          paVar8 = (anon_union_8_2_cb25d913_for_Wlc_Obj_t__10 *)paVar8->pFanins[0];
        }
        lVar23 = (long)paVar8->Fanins[0];
        if ((lVar23 < 1) || (p->nObjsAlloc <= paVar8->Fanins[0])) goto LAB_0036c8b4;
        pWVar20 = p->pObjs;
        iVar9 = pWVar20[lVar23].End - pWVar20[lVar23].Beg;
        iVar4 = -iVar9;
        if (0 < iVar9) {
          iVar4 = iVar9;
        }
        paVar8 = &pWVar2->field_10;
        if ((uVar1 & 0x2f) == 6 || 2 < pWVar2->nFanins) {
          paVar8 = (anon_union_8_2_cb25d913_for_Wlc_Obj_t__10 *)paVar8->pFanins[0];
        }
        lVar23 = (long)paVar8->Fanins[1];
        if ((lVar23 < 1) || (p->nObjsAlloc <= paVar8->Fanins[1])) goto LAB_0036c8b4;
        if (*(int *)((long)__ptr + 4) < 0x1f) goto LAB_0036c911;
        iVar17 = pWVar20[lVar23].End - pWVar20[lVar23].Beg;
        iVar9 = -iVar17;
        if (0 < iVar17) {
          iVar9 = iVar17;
        }
        *(int *)(__ptr[1] + 0x78) = *(int *)(__ptr[1] + 0x78) + iVar4 + iVar9 + 3;
        break;
      case 0x1f:
        paVar8 = &pWVar2->field_10;
        if (((uVar1 & 0x2f) == 6) || (2 < pWVar2->nFanins)) {
          paVar8 = (anon_union_8_2_cb25d913_for_Wlc_Obj_t__10 *)paVar8->pFanins[0];
        }
        lVar23 = (long)paVar8->Fanins[0];
        if ((lVar23 < 1) || (p->nObjsAlloc <= paVar8->Fanins[0])) goto LAB_0036c8b4;
        if (*(int *)((long)__ptr + 4) < 0x20) goto LAB_0036c911;
        iVar9 = p->pObjs[lVar23].End - p->pObjs[lVar23].Beg;
        iVar4 = -iVar9;
        if (0 < iVar9) {
          iVar4 = iVar9;
        }
        *(int *)(__ptr[1] + 0x7c) = *(int *)(__ptr[1] + 0x7c) + iVar4 * 4 + 3;
        break;
      case 0x20:
        paVar8 = &pWVar2->field_10;
        if (((uVar1 & 0x2f) == 6) || (2 < pWVar2->nFanins)) {
          paVar8 = (anon_union_8_2_cb25d913_for_Wlc_Obj_t__10 *)paVar8->pFanins[0];
        }
        lVar23 = (long)paVar8->Fanins[0];
        if ((lVar23 < 1) || (p->nObjsAlloc <= paVar8->Fanins[0])) goto LAB_0036c8b4;
        if (*(int *)((long)__ptr + 4) < 0x21) goto LAB_0036c911;
        iVar9 = p->pObjs[lVar23].End - p->pObjs[lVar23].Beg;
        iVar4 = -iVar9;
        if (0 < iVar9) {
          iVar4 = iVar9;
        }
        *(int *)(__ptr[1] + 0x80) = *(int *)(__ptr[1] + 0x80) + iVar4 * 4 + 3;
        break;
      case 0x21:
        paVar8 = &pWVar2->field_10;
        if (((uVar1 & 0x2f) == 6) || (2 < pWVar2->nFanins)) {
          paVar8 = (anon_union_8_2_cb25d913_for_Wlc_Obj_t__10 *)paVar8->pFanins[0];
        }
        lVar23 = (long)paVar8->Fanins[0];
        if ((lVar23 < 1) || (p->nObjsAlloc <= paVar8->Fanins[0])) goto LAB_0036c8b4;
        if (*(int *)((long)__ptr + 4) < 0x22) goto LAB_0036c911;
        iVar9 = p->pObjs[lVar23].End - p->pObjs[lVar23].Beg;
        iVar4 = -iVar9;
        if (0 < iVar9) {
          iVar4 = iVar9;
        }
        *(int *)(__ptr[1] + 0x84) = *(int *)(__ptr[1] + 0x84) + iVar4 * 6;
        break;
      case 0x22:
        paVar8 = &pWVar2->field_10;
        if (((uVar1 & 0x2f) == 6) || (2 < pWVar2->nFanins)) {
          paVar8 = (anon_union_8_2_cb25d913_for_Wlc_Obj_t__10 *)paVar8->pFanins[0];
        }
        lVar23 = (long)paVar8->Fanins[0];
        if ((lVar23 < 1) || (p->nObjsAlloc <= paVar8->Fanins[0])) goto LAB_0036c8b4;
        if (*(int *)((long)__ptr + 4) < 0x23) goto LAB_0036c911;
        iVar9 = p->pObjs[lVar23].End - p->pObjs[lVar23].Beg;
        iVar4 = -iVar9;
        if (0 < iVar9) {
          iVar4 = iVar9;
        }
        *(int *)(__ptr[1] + 0x88) = *(int *)(__ptr[1] + 0x88) + iVar4 * 6;
        break;
      case 0x23:
        paVar8 = &pWVar2->field_10;
        if (((uVar1 & 0x2f) == 6) || (2 < pWVar2->nFanins)) {
          paVar8 = (anon_union_8_2_cb25d913_for_Wlc_Obj_t__10 *)paVar8->pFanins[0];
        }
        lVar23 = (long)paVar8->Fanins[0];
        if ((lVar23 < 1) || (p->nObjsAlloc <= paVar8->Fanins[0])) goto LAB_0036c8b4;
        if (*(int *)((long)__ptr + 4) < 0x24) goto LAB_0036c911;
        iVar9 = p->pObjs[lVar23].End - p->pObjs[lVar23].Beg;
        iVar4 = -iVar9;
        if (0 < iVar9) {
          iVar4 = iVar9;
        }
        *(int *)(__ptr[1] + 0x8c) = *(int *)(__ptr[1] + 0x8c) + iVar4 * 6;
        break;
      case 0x24:
        paVar8 = &pWVar2->field_10;
        if (((uVar1 & 0x2f) == 6) || (2 < pWVar2->nFanins)) {
          paVar8 = (anon_union_8_2_cb25d913_for_Wlc_Obj_t__10 *)paVar8->pFanins[0];
        }
        lVar23 = (long)paVar8->Fanins[0];
        if ((lVar23 < 1) || (p->nObjsAlloc <= paVar8->Fanins[0])) goto LAB_0036c8b4;
        if (*(int *)((long)__ptr + 4) < 0x25) goto LAB_0036c911;
        iVar9 = p->pObjs[lVar23].End - p->pObjs[lVar23].Beg;
        iVar4 = -iVar9;
        if (0 < iVar9) {
          iVar4 = iVar9;
        }
        *(int *)(__ptr[1] + 0x90) = *(int *)(__ptr[1] + 0x90) + iVar4 * 6;
        break;
      case 0x25:
        paVar8 = &pWVar2->field_10;
        if (((uVar1 & 0x2f) == 6) || (2 < pWVar2->nFanins)) {
          paVar8 = (anon_union_8_2_cb25d913_for_Wlc_Obj_t__10 *)paVar8->pFanins[0];
        }
        lVar23 = (long)paVar8->Fanins[0];
        if ((lVar23 < 1) || (p->nObjsAlloc <= paVar8->Fanins[0])) goto LAB_0036c8b4;
        if (*(int *)((long)__ptr + 4) < 0x26) goto LAB_0036c911;
        iVar9 = p->pObjs[lVar23].End - p->pObjs[lVar23].Beg;
        iVar4 = -iVar9;
        if (0 < iVar9) {
          iVar4 = iVar9;
        }
        *(int *)(__ptr[1] + 0x94) = *(int *)(__ptr[1] + 0x94) + iVar4;
        break;
      case 0x26:
        paVar8 = &pWVar2->field_10;
        if (((uVar1 & 0x2f) == 6) || (2 < pWVar2->nFanins)) {
          paVar8 = (anon_union_8_2_cb25d913_for_Wlc_Obj_t__10 *)paVar8->pFanins[0];
        }
        lVar23 = (long)paVar8->Fanins[0];
        if ((lVar23 < 1) || (p->nObjsAlloc <= paVar8->Fanins[0])) goto LAB_0036c8b4;
        if (*(int *)((long)__ptr + 4) < 0x27) goto LAB_0036c911;
        iVar9 = p->pObjs[lVar23].End - p->pObjs[lVar23].Beg;
        iVar4 = -iVar9;
        if (0 < iVar9) {
          iVar4 = iVar9;
        }
        *(int *)(__ptr[1] + 0x98) = *(int *)(__ptr[1] + 0x98) + iVar4;
        break;
      case 0x27:
        paVar8 = &pWVar2->field_10;
        if (((uVar1 & 0x2f) == 6) || (2 < pWVar2->nFanins)) {
          paVar8 = (anon_union_8_2_cb25d913_for_Wlc_Obj_t__10 *)paVar8->pFanins[0];
        }
        lVar23 = (long)paVar8->Fanins[0];
        if ((lVar23 < 1) || (p->nObjsAlloc <= paVar8->Fanins[0])) goto LAB_0036c8b4;
        if (*(int *)((long)__ptr + 4) < 0x28) goto LAB_0036c911;
        iVar9 = p->pObjs[lVar23].End - p->pObjs[lVar23].Beg;
        iVar4 = -iVar9;
        if (0 < iVar9) {
          iVar4 = iVar9;
        }
        *(int *)(__ptr[1] + 0x9c) = *(int *)(__ptr[1] + 0x9c) + iVar4 * 3;
        break;
      case 0x28:
        paVar8 = &pWVar2->field_10;
        if (((uVar1 & 0x2f) == 6) || (2 < pWVar2->nFanins)) {
          paVar8 = (anon_union_8_2_cb25d913_for_Wlc_Obj_t__10 *)paVar8->pFanins[0];
        }
        lVar23 = (long)paVar8->Fanins[0];
        if ((lVar23 < 1) || (p->nObjsAlloc <= paVar8->Fanins[0])) goto LAB_0036c8b4;
        if (*(int *)((long)__ptr + 4) < 0x29) goto LAB_0036c911;
        iVar9 = p->pObjs[lVar23].End - p->pObjs[lVar23].Beg;
        iVar4 = -iVar9;
        if (0 < iVar9) {
          iVar4 = iVar9;
        }
        *(int *)(__ptr[1] + 0xa0) = *(int *)(__ptr[1] + 0xa0) + iVar4;
        break;
      case 0x29:
        paVar8 = &pWVar2->field_10;
        if (((uVar1 & 0x2f) == 6) || (2 < pWVar2->nFanins)) {
          paVar8 = (anon_union_8_2_cb25d913_for_Wlc_Obj_t__10 *)paVar8->pFanins[0];
        }
        lVar23 = (long)paVar8->Fanins[0];
        if ((lVar23 < 1) || (p->nObjsAlloc <= paVar8->Fanins[0])) goto LAB_0036c8b4;
        if (*(int *)((long)__ptr + 4) < 0x2a) goto LAB_0036c911;
        iVar9 = p->pObjs[lVar23].End - p->pObjs[lVar23].Beg;
        iVar4 = -iVar9;
        if (0 < iVar9) {
          iVar4 = iVar9;
        }
        *(int *)(__ptr[1] + 0xa4) = *(int *)(__ptr[1] + 0xa4) + iVar4;
        break;
      case 0x2a:
        paVar8 = &pWVar2->field_10;
        if (((uVar1 & 0x2f) == 6) || (2 < pWVar2->nFanins)) {
          paVar8 = (anon_union_8_2_cb25d913_for_Wlc_Obj_t__10 *)paVar8->pFanins[0];
        }
        lVar23 = (long)paVar8->Fanins[0];
        if ((lVar23 < 1) || (p->nObjsAlloc <= paVar8->Fanins[0])) goto LAB_0036c8b4;
        if (*(int *)((long)__ptr + 4) < 0x2b) goto LAB_0036c911;
        iVar9 = p->pObjs[lVar23].End - p->pObjs[lVar23].Beg;
        iVar4 = -iVar9;
        if (0 < iVar9) {
          iVar4 = iVar9;
        }
        *(int *)(__ptr[1] + 0xa8) = *(int *)(__ptr[1] + 0xa8) + iVar4 * 3;
        break;
      case 0x2b:
        paVar8 = &pWVar2->field_10;
        if (((uVar1 & 0x2f) == 6) || (2 < pWVar2->nFanins)) {
          paVar8 = (anon_union_8_2_cb25d913_for_Wlc_Obj_t__10 *)paVar8->pFanins[0];
        }
        lVar23 = (long)paVar8->Fanins[0];
        if ((lVar23 < 1) || (p->nObjsAlloc <= paVar8->Fanins[0])) goto LAB_0036c8b4;
        if (*(int *)((long)__ptr + 4) < 0x2c) goto LAB_0036c911;
        iVar9 = p->pObjs[lVar23].End - p->pObjs[lVar23].Beg;
        iVar4 = -iVar9;
        if (0 < iVar9) {
          iVar4 = iVar9;
        }
        *(int *)(__ptr[1] + 0xac) = iVar4 * 9 + *(int *)(__ptr[1] + 0xac) + 9;
        break;
      case 0x2c:
        paVar8 = &pWVar2->field_10;
        if (((uVar1 & 0x2f) == 6) || (2 < pWVar2->nFanins)) {
          paVar8 = (anon_union_8_2_cb25d913_for_Wlc_Obj_t__10 *)paVar8->pFanins[0];
        }
        lVar23 = (long)paVar8->Fanins[0];
        if ((lVar23 < 1) || (p->nObjsAlloc <= paVar8->Fanins[0])) goto LAB_0036c8b4;
        if (*(int *)((long)__ptr + 4) < 0x2d) goto LAB_0036c911;
        iVar9 = p->pObjs[lVar23].End - p->pObjs[lVar23].Beg;
        iVar4 = -iVar9;
        if (0 < iVar9) {
          iVar4 = iVar9;
        }
        *(int *)(__ptr[1] + 0xb0) = iVar4 * 9 + *(int *)(__ptr[1] + 0xb0) + 9;
        break;
      case 0x2d:
        paVar8 = &pWVar2->field_10;
        if ((uVar1 & 0x2f) == 6 || 2 < pWVar2->nFanins) {
          paVar8 = (anon_union_8_2_cb25d913_for_Wlc_Obj_t__10 *)paVar8->pFanins[0];
        }
        lVar23 = (long)paVar8->Fanins[0];
        if ((lVar23 < 1) || (p->nObjsAlloc <= paVar8->Fanins[0])) goto LAB_0036c8b4;
        pWVar20 = p->pObjs;
        iVar9 = pWVar20[lVar23].End - pWVar20[lVar23].Beg;
        iVar4 = -iVar9;
        if (0 < iVar9) {
          iVar4 = iVar9;
        }
        paVar8 = &pWVar2->field_10;
        if ((uVar1 & 0x2f) == 6 || 2 < pWVar2->nFanins) {
          paVar8 = (anon_union_8_2_cb25d913_for_Wlc_Obj_t__10 *)paVar8->pFanins[0];
        }
        lVar23 = (long)paVar8->Fanins[1];
        if ((lVar23 < 1) || (p->nObjsAlloc <= paVar8->Fanins[1])) goto LAB_0036c8b4;
        if (*(int *)((long)__ptr + 4) < 0x2e) goto LAB_0036c911;
        iVar17 = pWVar20[lVar23].End - pWVar20[lVar23].Beg;
        iVar9 = -iVar17;
        if (0 < iVar17) {
          iVar9 = iVar17;
        }
        *(int *)(__ptr[1] + 0xb4) = *(int *)(__ptr[1] + 0xb4) + (iVar9 + 1) * (iVar4 * 9 + 9);
        break;
      case 0x2e:
        uVar12 = pWVar2->nFanins;
        paVar8 = &pWVar2->field_10;
        if ((uVar1 & 0x2f) == 6 || 2 < uVar12) {
          paVar8 = (anon_union_8_2_cb25d913_for_Wlc_Obj_t__10 *)paVar8->pFanins[0];
        }
        lVar23 = (long)paVar8->Fanins[0];
        if ((lVar23 < 1) || (iVar4 = p->nObjsAlloc, iVar4 <= paVar8->Fanins[0])) goto LAB_0036c8b4;
        pWVar20 = p->pObjs;
        iVar17 = pWVar20[lVar23].End - pWVar20[lVar23].Beg;
        iVar9 = -iVar17;
        if (0 < iVar17) {
          iVar9 = iVar17;
        }
        paVar8 = &pWVar2->field_10;
        if ((uVar1 & 0x2f) == 6 || 2 < uVar12) {
          paVar8 = (anon_union_8_2_cb25d913_for_Wlc_Obj_t__10 *)paVar8->pFanins[0];
        }
        lVar23 = (long)paVar8->Fanins[0];
        if ((lVar23 < 1) || (iVar4 <= paVar8->Fanins[0])) goto LAB_0036c8b4;
        iVar19 = pWVar20[lVar23].End - pWVar20[lVar23].Beg;
        iVar17 = -iVar19;
        if (0 < iVar19) {
          iVar17 = iVar19;
        }
        paVar8 = &pWVar2->field_10;
        if ((uVar1 & 0x2f) == 6 || 2 < uVar12) {
          paVar8 = (anon_union_8_2_cb25d913_for_Wlc_Obj_t__10 *)paVar8->pFanins[0];
        }
        lVar23 = (long)paVar8->Fanins[0];
        if ((lVar23 < 1) || (iVar4 <= paVar8->Fanins[0])) goto LAB_0036c8b4;
        if (*(int *)((long)__ptr + 4) < 0x2f) goto LAB_0036c911;
        iVar19 = pWVar20[lVar23].End - pWVar20[lVar23].Beg;
        iVar4 = -iVar19;
        if (0 < iVar19) {
          iVar4 = iVar19;
        }
        *(int *)(__ptr[1] + 0xb8) =
             iVar4 * -0x13 + (iVar17 + 1) * (iVar9 * 0xd + 0xd) + *(int *)(__ptr[1] + 0xb8) + -9;
        break;
      case 0x2f:
        uVar12 = pWVar2->nFanins;
        paVar8 = &pWVar2->field_10;
        if ((uVar1 & 0x2f) == 6 || 2 < uVar12) {
          paVar8 = (anon_union_8_2_cb25d913_for_Wlc_Obj_t__10 *)paVar8->pFanins[0];
        }
        lVar23 = (long)paVar8->Fanins[0];
        if ((lVar23 < 1) || (iVar4 = p->nObjsAlloc, iVar4 <= paVar8->Fanins[0])) goto LAB_0036c8b4;
        pWVar20 = p->pObjs;
        iVar17 = pWVar20[lVar23].End - pWVar20[lVar23].Beg;
        iVar9 = -iVar17;
        if (0 < iVar17) {
          iVar9 = iVar17;
        }
        paVar8 = &pWVar2->field_10;
        if ((uVar1 & 0x2f) == 6 || 2 < uVar12) {
          paVar8 = (anon_union_8_2_cb25d913_for_Wlc_Obj_t__10 *)paVar8->pFanins[0];
        }
        lVar23 = (long)paVar8->Fanins[0];
        if ((lVar23 < 1) || (iVar4 <= paVar8->Fanins[0])) goto LAB_0036c8b4;
        iVar19 = pWVar20[lVar23].End - pWVar20[lVar23].Beg;
        iVar17 = -iVar19;
        if (0 < iVar19) {
          iVar17 = iVar19;
        }
        paVar8 = &pWVar2->field_10;
        if ((uVar1 & 0x2f) == 6 || 2 < uVar12) {
          paVar8 = (anon_union_8_2_cb25d913_for_Wlc_Obj_t__10 *)paVar8->pFanins[0];
        }
        lVar23 = (long)paVar8->Fanins[0];
        if ((lVar23 < 1) || (iVar4 <= paVar8->Fanins[0])) goto LAB_0036c8b4;
        if (*(int *)((long)__ptr + 4) < 0x30) goto LAB_0036c911;
        iVar19 = pWVar20[lVar23].End - pWVar20[lVar23].Beg;
        iVar4 = -iVar19;
        if (0 < iVar19) {
          iVar4 = iVar19;
        }
        *(int *)(__ptr[1] + 0xbc) =
             iVar4 * -7 + (iVar17 + 1) * (iVar9 * 0xd + 0xd) + *(int *)(__ptr[1] + 0xbc) + -9;
        break;
      case 0x30:
        uVar12 = pWVar2->nFanins;
        paVar8 = &pWVar2->field_10;
        if ((uVar1 & 0x2f) == 6 || 2 < uVar12) {
          paVar8 = (anon_union_8_2_cb25d913_for_Wlc_Obj_t__10 *)paVar8->pFanins[0];
        }
        lVar23 = (long)paVar8->Fanins[0];
        if ((lVar23 < 1) || (iVar4 = p->nObjsAlloc, iVar4 <= paVar8->Fanins[0])) goto LAB_0036c8b4;
        pWVar20 = p->pObjs;
        iVar17 = pWVar20[lVar23].End - pWVar20[lVar23].Beg;
        iVar9 = -iVar17;
        if (0 < iVar17) {
          iVar9 = iVar17;
        }
        paVar8 = &pWVar2->field_10;
        if ((uVar1 & 0x2f) == 6 || 2 < uVar12) {
          paVar8 = (anon_union_8_2_cb25d913_for_Wlc_Obj_t__10 *)paVar8->pFanins[0];
        }
        lVar23 = (long)paVar8->Fanins[0];
        if ((lVar23 < 1) || (iVar4 <= paVar8->Fanins[0])) goto LAB_0036c8b4;
        iVar19 = pWVar20[lVar23].End - pWVar20[lVar23].Beg;
        iVar17 = -iVar19;
        if (0 < iVar19) {
          iVar17 = iVar19;
        }
        paVar8 = &pWVar2->field_10;
        if ((uVar1 & 0x2f) == 6 || 2 < uVar12) {
          paVar8 = (anon_union_8_2_cb25d913_for_Wlc_Obj_t__10 *)paVar8->pFanins[0];
        }
        lVar23 = (long)paVar8->Fanins[0];
        if ((lVar23 < 1) || (iVar4 <= paVar8->Fanins[0])) goto LAB_0036c8b4;
        if (*(int *)((long)__ptr + 4) < 0x31) goto LAB_0036c911;
        iVar19 = pWVar20[lVar23].End - pWVar20[lVar23].Beg;
        iVar4 = -iVar19;
        if (0 < iVar19) {
          iVar4 = iVar19;
        }
        *(int *)(__ptr[1] + 0xc0) =
             iVar4 * -7 + (iVar17 + 1) * (iVar9 * 0xd + 0xd) + *(int *)(__ptr[1] + 0xc0) + -9;
        break;
      case 0x31:
        paVar8 = &pWVar2->field_10;
        if ((uVar1 & 0x2f) == 6 || 2 < pWVar2->nFanins) {
          paVar8 = (anon_union_8_2_cb25d913_for_Wlc_Obj_t__10 *)paVar8->pFanins[0];
        }
        lVar23 = (long)paVar8->Fanins[0];
        if ((lVar23 < 1) || (p->nObjsAlloc <= paVar8->Fanins[0])) goto LAB_0036c8b4;
        pWVar20 = p->pObjs;
        iVar9 = pWVar20[lVar23].End - pWVar20[lVar23].Beg;
        iVar4 = -iVar9;
        if (0 < iVar9) {
          iVar4 = iVar9;
        }
        paVar8 = &pWVar2->field_10;
        if ((uVar1 & 0x2f) == 6 || 2 < pWVar2->nFanins) {
          paVar8 = (anon_union_8_2_cb25d913_for_Wlc_Obj_t__10 *)paVar8->pFanins[0];
        }
        lVar23 = (long)paVar8->Fanins[0];
        if ((lVar23 < 1) || (p->nObjsAlloc <= paVar8->Fanins[0])) goto LAB_0036c8b4;
        iVar17 = pWVar20[lVar23].End - pWVar20[lVar23].Beg;
        iVar9 = -iVar17;
        if (0 < iVar17) {
          iVar9 = iVar17;
        }
        dVar27 = pow((double)(iVar4 + 1),(double)(iVar9 + 1));
        if (*(int *)((long)__ptr + 4) < 0x32) goto LAB_0036c911;
        *(int *)(__ptr[1] + 0xc4) = *(int *)(__ptr[1] + 0xc4) + (int)dVar27 * 10;
        break;
      case 0x32:
        paVar8 = &pWVar2->field_10;
        if (((uVar1 & 0x2f) == 6) || (2 < pWVar2->nFanins)) {
          paVar8 = (anon_union_8_2_cb25d913_for_Wlc_Obj_t__10 *)paVar8->pFanins[0];
        }
        lVar23 = (long)paVar8->Fanins[0];
        if ((lVar23 < 1) || (p->nObjsAlloc <= paVar8->Fanins[0])) goto LAB_0036c8b4;
        if (*(int *)((long)__ptr + 4) < 0x33) goto LAB_0036c911;
        iVar9 = p->pObjs[lVar23].End - p->pObjs[lVar23].Beg;
        iVar4 = -iVar9;
        if (0 < iVar9) {
          iVar4 = iVar9;
        }
        *(int *)(__ptr[1] + 200) = *(int *)(__ptr[1] + 200) + iVar4 * 4 + 4;
        break;
      case 0x33:
        uVar12 = pWVar2->nFanins;
        paVar8 = &pWVar2->field_10;
        if ((uVar1 & 0x2f) == 6 || 2 < uVar12) {
          paVar8 = (anon_union_8_2_cb25d913_for_Wlc_Obj_t__10 *)paVar8->pFanins[0];
        }
        lVar23 = (long)paVar8->Fanins[0];
        if ((lVar23 < 1) || (iVar4 = p->nObjsAlloc, iVar4 <= paVar8->Fanins[0])) goto LAB_0036c8b4;
        pWVar20 = p->pObjs;
        iVar17 = pWVar20[lVar23].End - pWVar20[lVar23].Beg;
        iVar9 = -iVar17;
        if (0 < iVar17) {
          iVar9 = iVar17;
        }
        paVar8 = &pWVar2->field_10;
        if ((uVar1 & 0x2f) == 6 || 2 < uVar12) {
          paVar8 = (anon_union_8_2_cb25d913_for_Wlc_Obj_t__10 *)paVar8->pFanins[0];
        }
        lVar23 = (long)paVar8->Fanins[0];
        if ((lVar23 < 1) || (iVar4 <= paVar8->Fanins[0])) goto LAB_0036c8b4;
        iVar19 = pWVar20[lVar23].End - pWVar20[lVar23].Beg;
        iVar17 = -iVar19;
        if (0 < iVar19) {
          iVar17 = iVar19;
        }
        iVar17 = (iVar17 + 1) * (iVar9 * 0xb + 0xb);
        iVar9 = iVar17 + 7;
        if (-1 < iVar17) {
          iVar9 = iVar17;
        }
        paVar8 = &pWVar2->field_10;
        if ((uVar1 & 0x2f) == 6 || 2 < uVar12) {
          paVar8 = (anon_union_8_2_cb25d913_for_Wlc_Obj_t__10 *)paVar8->pFanins[0];
        }
        lVar23 = (long)paVar8->Fanins[0];
        if ((lVar23 < 1) || (iVar4 <= paVar8->Fanins[0])) goto LAB_0036c8b4;
        if (*(int *)((long)__ptr + 4) < 0x34) goto LAB_0036c911;
        iVar17 = pWVar20[lVar23].End - pWVar20[lVar23].Beg;
        iVar4 = -iVar17;
        if (0 < iVar17) {
          iVar4 = iVar17;
        }
        *(int *)(__ptr[1] + 0xcc) =
             ((iVar4 * 5 - (iVar4 * 5 + 5 >> 0x1f)) + 5 >> 1) +
             (iVar9 >> 3) + *(int *)(__ptr[1] + 0xcc) + -5;
        break;
      case 0x34:
        paVar8 = &pWVar2->field_10;
        if ((uVar1 & 0x2f) == 6 || 2 < pWVar2->nFanins) {
          paVar8 = (anon_union_8_2_cb25d913_for_Wlc_Obj_t__10 *)paVar8->pFanins[0];
        }
        lVar23 = (long)paVar8->Fanins[0];
        if ((lVar23 < 1) || (p->nObjsAlloc <= paVar8->Fanins[0])) goto LAB_0036c8b4;
        pWVar20 = p->pObjs;
        iVar9 = pWVar20[lVar23].End - pWVar20[lVar23].Beg;
        iVar4 = -iVar9;
        if (0 < iVar9) {
          iVar4 = iVar9;
        }
        paVar8 = &pWVar2->field_10;
        if ((uVar1 & 0x2f) == 6 || 2 < pWVar2->nFanins) {
          paVar8 = (anon_union_8_2_cb25d913_for_Wlc_Obj_t__10 *)paVar8->pFanins[0];
        }
        lVar23 = (long)paVar8->Fanins[1];
        if ((lVar23 < 1) || (p->nObjsAlloc <= paVar8->Fanins[1])) goto LAB_0036c8b4;
        if (*(int *)((long)__ptr + 4) < 0x35) goto LAB_0036c911;
        iVar17 = pWVar20[lVar23].End - pWVar20[lVar23].Beg;
        iVar9 = -iVar17;
        if (0 < iVar17) {
          iVar9 = iVar17;
        }
        *(int *)(__ptr[1] + 0xd0) = *(int *)(__ptr[1] + 0xd0) + (iVar9 + 1) * (iVar4 * 5 + 5);
      }
      iVar15 = iVar15 + (uint)(iVar10 != 0);
      uVar22 = uVar22 + 1;
      pWVar20 = pWVar21;
    } while ((long)uVar22 < (long)p->iObj);
  }
  if ((iVar15 != 0) && (0 < (p->vNameIds).nSize)) {
    printf("Warning: %d objects of the design have non-zero-based ranges.\n");
    uVar22 = ((long)pWVar21 - (long)p->pObjs >> 3) * -0x5555555555555555;
    uVar12 = (uint)uVar22;
    if (((int)uVar12 < 0) || ((p->vNameIds).nSize <= (int)uVar12)) {
LAB_0036c8d3:
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                    ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
    }
    pcVar7 = Abc_NamStr(p->pManName,(p->vNameIds).pArray[uVar12 & 0x7fffffff]);
    iVar10 = pWVar21->End - pWVar21->Beg;
    iVar15 = -iVar10;
    if (0 < iVar10) {
      iVar15 = iVar10;
    }
    printf("In particular, object %6d with name \"%s\" has range %d=[%d:%d]\n",uVar22 & 0xffffffff,
           pcVar7,(ulong)(iVar15 + 1));
  }
  pcVar7 = "     Left Share Right";
  if (bVar26 || bVar25) {
    pcVar7 = "";
  }
  printf("ID  :  name  occurrence%s    and2 (occurrence)<output_range>=<input_range>.<input_range> ...\n"
         ,pcVar7);
  pcVar7 = "-";
  uVar22 = 0;
  do {
    if (p->nObjs[uVar22] != 0) {
      pvVar5 = __s[uVar22];
      pvVar3 = __s_00[uVar22];
      printf("%2d  :  %-8s  %6d",uVar22 & 0xffffffff,Wlc_Names[uVar22]);
      if (!bVar26 && !bVar25) {
        if (uVar22 == 1) {
          iVar15 = Wlc_NtkCountRealPis(p);
        }
        else {
          iVar15 = p->nObjs[uVar22];
        }
        printf("   ");
        uVar12 = local_218[uVar22];
        printf("%6d",(ulong)uVar12);
        uVar18 = auStack_128[uVar22];
        printf("%6d",(ulong)((uVar12 - iVar15) + uVar18));
        printf("%6d",(ulong)uVar18);
      }
      if ((long)*(int *)((long)__ptr + 4) <= (long)uVar22) goto LAB_0036c8d3;
      printf("%8d ",(ulong)*(uint *)(__ptr[1] + uVar22 * 4));
      Wlc_NtkPrintDistribSortOne(vTypes,vOccurs,(int)uVar22);
      if (0 < *(int *)((long)pvVar5 + 4)) {
        uVar13 = 0;
        do {
          uVar11 = *(ulong *)(*(long *)((long)pvVar5 + 8) + uVar13 * 8);
          if (((((int)(uVar13 / 6) * 6 + 5U == (uint)uVar13) && (0x3ffffffffff < uVar11)) ||
              (((~(uint)uVar13 & 7) == 0 && (uVar11 < 0x40000000000)))) &&
             (printf("\n                                "), !bVar26 && !bVar25)) {
            printf("                     ");
          }
          if ((long)*(int *)((long)pvVar3 + 4) <= (long)uVar13) {
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecWrd.h"
                          ,0x1ad,"word Vec_WrdEntry(Vec_Wrd_t *, int)");
          }
          uVar24 = uVar11 >> 0x15;
          printf("(%d)",(ulong)*(uint *)(*(long *)((long)pvVar3 + 8) + uVar13 * 8));
          pcVar16 = pcVar7;
          if ((uVar11 & 1) == 0) {
            pcVar16 = "";
          }
          printf("%s%d",pcVar16,(ulong)((uint)(uVar11 >> 1) & 0xfffff));
          if ((uVar24 & 0x1fffff) != 0) {
            pcVar16 = pcVar7;
            if ((uVar24 & 1) == 0) {
              pcVar16 = "";
            }
            printf("=%s%d",pcVar16,(ulong)(((uint)uVar24 & 0x1fffff) >> 1));
          }
          if (0x3ffffffffff < uVar11) {
            pcVar16 = pcVar7;
            if ((uVar11 >> 0x2a & 1) == 0) {
              pcVar16 = "";
            }
            printf(".%s%d",pcVar16,uVar11 >> 0x2b);
          }
          putchar(0x20);
          uVar13 = uVar13 + 1;
        } while ((long)uVar13 < (long)*(int *)((long)pvVar5 + 4));
      }
      putchar(10);
    }
    uVar22 = uVar22 + 1;
    if (uVar22 == 0x3c) {
      lVar23 = 0;
      do {
        pvVar5 = __s[lVar23];
        if (pvVar5 != (void *)0x0) {
          if (*(void **)((long)pvVar5 + 8) != (void *)0x0) {
            free(*(void **)((long)pvVar5 + 8));
            *(undefined8 *)((long)pvVar5 + 8) = 0;
          }
          free(pvVar5);
        }
        lVar23 = lVar23 + 1;
      } while (lVar23 != 0x3c);
      if (__s != (void **)0x0) {
        free(__s);
        vTypes->pArray = (void **)0x0;
      }
      free(vTypes);
      lVar23 = 0;
      do {
        pvVar5 = __s_00[lVar23];
        if (pvVar5 != (void *)0x0) {
          if (*(void **)((long)pvVar5 + 8) != (void *)0x0) {
            free(*(void **)((long)pvVar5 + 8));
            *(undefined8 *)((long)pvVar5 + 8) = 0;
          }
          free(pvVar5);
        }
        lVar23 = lVar23 + 1;
      } while (lVar23 != 0x3c);
      if (__s_00 != (void **)0x0) {
        free(__s_00);
        vOccurs->pArray = (void **)0x0;
      }
      free(vOccurs);
      if ((void *)__ptr[1] != (void *)0x0) {
        free((void *)__ptr[1]);
        __ptr[1] = 0;
      }
      free(__ptr);
      return;
    }
  } while( true );
}

Assistant:

void Wlc_NtkPrintDistrib( Wlc_Ntk_t * p, int fTwoSides, int fVerbose )
{
    int nObjs[2][WLC_OBJ_NUMBER] = {{0}}; // counter of objects of each type
    Wlc_Obj_t * pObj, * pObjRange = NULL; int nCountRange = 0;
    Vec_Ptr_t * vTypes, * vOccurs;
    Vec_Int_t * vAnds = Vec_IntStart( WLC_OBJ_NUMBER );
    word Sign = 0;
    int i, k, s, s0, s1;
    if ( Wlc_NtkPoNum(p) != 2 )
        fTwoSides = 0;
    if ( fTwoSides )
        Wlc_NtkCollectStats( p, nObjs );
    // allocate statistics arrays
    vTypes  = Vec_PtrStart( WLC_OBJ_NUMBER );
    vOccurs = Vec_PtrStart( WLC_OBJ_NUMBER );
    for ( i = 0; i < WLC_OBJ_NUMBER; i++ )
        Vec_PtrWriteEntry( vTypes, i, Vec_WrdAlloc(16) );
    for ( i = 0; i < WLC_OBJ_NUMBER; i++ )
        Vec_PtrWriteEntry( vOccurs, i, Vec_WrdAlloc(16) );
    // add nodes
    Wlc_NtkForEachObj( p, pObj, i )
    {
//        char * pName = Wlc_ObjName(p, i);
        if ( Wlc_ObjSign(pObj) > 0x1FFFFF )
            printf( "Object %6d has range %d, which is reduced to %d in the statistics.\n", 
                i, Wlc_ObjRange(pObj), Wlc_ObjRange(pObj) & 0xFFFFF );
        if ( pObj->Beg )
        {
            if ( pObjRange == NULL )
                pObjRange = pObj;
            nCountRange++;
        }
        // 0-input types
        if ( Wlc_ObjIsCi(pObj) || pObj->Type == WLC_OBJ_CONST || pObj->Type == WLC_OBJ_BIT_CONCAT )
            Sign = Wlc_NtkPrintDistribMakeSign( Wlc_ObjSign(pObj), 0, 0 );
        // 1-input types
        else if ( pObj->Type == WLC_OBJ_BUF    || pObj->Type == WLC_OBJ_BIT_SELECT  || pObj->Type == WLC_OBJ_TABLE ||
             pObj->Type == WLC_OBJ_BIT_ZEROPAD || pObj->Type == WLC_OBJ_BIT_SIGNEXT || 
             pObj->Type == WLC_OBJ_BIT_NOT     || pObj->Type == WLC_OBJ_LOGIC_NOT   || pObj->Type == WLC_OBJ_ARI_MINUS )
            Sign = Wlc_NtkPrintDistribMakeSign( Wlc_ObjSign(pObj), Wlc_ObjSign(Wlc_ObjFanin0(p, pObj)), 0 );
        // 2-input types (including MUX)
        else if ( Wlc_ObjFaninNum(pObj) == 0 )
            printf( "Object %d with name \"%s\" has type 0. Looks like it was declared by not defined...\n", i, Wlc_ObjName(p, i) );
        else if ( Wlc_ObjFaninNum(pObj) == 1 )
            Sign = Wlc_NtkPrintDistribMakeSign( Wlc_ObjSign(pObj), Wlc_ObjSign(Wlc_ObjFanin0(p, pObj)), 0 );
        else
        {
            assert( Wlc_ObjFaninNum(pObj) >= 2 );
            Sign = Wlc_NtkPrintDistribMakeSign( Wlc_ObjSign(pObj), Wlc_ObjFaninId(pObj, 0) ? Wlc_ObjSign(Wlc_ObjFanin0(p, pObj)) : 0, Wlc_ObjFaninId(pObj, 1) ? Wlc_ObjSign(Wlc_ObjFanin1(p, pObj)) : 0 );
        }
        // add to storage
        Wlc_NtkPrintDistribAddOne( vTypes, vOccurs, pObj->Type, Sign );
        // count the number of AIG nodes
        if ( pObj->Type == WLC_OBJ_MUX )
            Vec_IntAddToEntry( vAnds, WLC_OBJ_MUX,      3 * Wlc_ObjRange(pObj) * (Wlc_ObjFaninNum(pObj) - 2) );
        else if ( pObj->Type == WLC_OBJ_SHIFT_R )      
            Vec_IntAddToEntry( vAnds, WLC_OBJ_SHIFT_R,  Abc_MinInt(Wlc_ObjRange(Wlc_ObjFanin0(p, pObj)), Abc_Base2Log(Wlc_ObjRange(pObj))) * 3 );
        else if ( pObj->Type == WLC_OBJ_SHIFT_RA )     
            Vec_IntAddToEntry( vAnds, WLC_OBJ_SHIFT_RA, Wlc_ObjRange(pObj) * Abc_MinInt(Wlc_ObjRange(Wlc_ObjFanin0(p, pObj)), Abc_Base2Log(Wlc_ObjRange(pObj))) * 3 );
        else if ( pObj->Type == WLC_OBJ_SHIFT_L )      
            Vec_IntAddToEntry( vAnds, WLC_OBJ_SHIFT_L,  Wlc_ObjRange(pObj) * Abc_MinInt(Wlc_ObjRange(Wlc_ObjFanin0(p, pObj)), Abc_Base2Log(Wlc_ObjRange(pObj))) * 3 );
        else if ( pObj->Type == WLC_OBJ_SHIFT_LA )     
            Vec_IntAddToEntry( vAnds, WLC_OBJ_SHIFT_LA, Wlc_ObjRange(pObj) * Abc_MinInt(Wlc_ObjRange(Wlc_ObjFanin0(p, pObj)), Abc_Base2Log(Wlc_ObjRange(pObj))) * 3 );
        else if ( pObj->Type == WLC_OBJ_ROTATE_R )     
            Vec_IntAddToEntry( vAnds, WLC_OBJ_ROTATE_R, Wlc_ObjRange(pObj) * Abc_MinInt(Wlc_ObjRange(Wlc_ObjFanin0(p, pObj)), Abc_Base2Log(Wlc_ObjRange(pObj))) * 3 );
        else if ( pObj->Type == WLC_OBJ_ROTATE_L )     
            Vec_IntAddToEntry( vAnds, WLC_OBJ_ROTATE_L, Wlc_ObjRange(pObj) * Abc_MinInt(Wlc_ObjRange(Wlc_ObjFanin0(p, pObj)), Abc_Base2Log(Wlc_ObjRange(pObj))) * 3 );
        else if ( pObj->Type == WLC_OBJ_BIT_NOT )     
            Vec_IntAddToEntry( vAnds, WLC_OBJ_BIT_NOT, 0 );
        else if ( pObj->Type == WLC_OBJ_BIT_AND )      
            Vec_IntAddToEntry( vAnds, WLC_OBJ_BIT_AND,      Wlc_ObjRange(Wlc_ObjFanin0(p, pObj)) );
        else if ( pObj->Type == WLC_OBJ_BIT_OR )       
            Vec_IntAddToEntry( vAnds, WLC_OBJ_BIT_OR,       Wlc_ObjRange(Wlc_ObjFanin0(p, pObj)) );
        else if ( pObj->Type == WLC_OBJ_BIT_XOR )      
            Vec_IntAddToEntry( vAnds, WLC_OBJ_BIT_XOR,  3 * Wlc_ObjRange(Wlc_ObjFanin0(p, pObj)) );
        else if ( pObj->Type == WLC_OBJ_BIT_NAND )      
            Vec_IntAddToEntry( vAnds, WLC_OBJ_BIT_NAND,     Wlc_ObjRange(Wlc_ObjFanin0(p, pObj)) );
        else if ( pObj->Type == WLC_OBJ_BIT_NOR )       
            Vec_IntAddToEntry( vAnds, WLC_OBJ_BIT_NOR,      Wlc_ObjRange(Wlc_ObjFanin0(p, pObj)) );
        else if ( pObj->Type == WLC_OBJ_BIT_NXOR )      
            Vec_IntAddToEntry( vAnds, WLC_OBJ_BIT_NXOR, 3 * Wlc_ObjRange(Wlc_ObjFanin0(p, pObj)) );
        else if ( pObj->Type == WLC_OBJ_BIT_SELECT )   
            Vec_IntAddToEntry( vAnds, WLC_OBJ_BIT_SELECT, 0 );
        else if ( pObj->Type == WLC_OBJ_BIT_CONCAT )   
            Vec_IntAddToEntry( vAnds, WLC_OBJ_BIT_CONCAT, 0 );
        else if ( pObj->Type == WLC_OBJ_BIT_ZEROPAD )  
            Vec_IntAddToEntry( vAnds, WLC_OBJ_BIT_ZEROPAD, 0 );
        else if ( pObj->Type == WLC_OBJ_BIT_SIGNEXT )  
            Vec_IntAddToEntry( vAnds, WLC_OBJ_BIT_SIGNEXT, 0 );
        else if ( pObj->Type == WLC_OBJ_LOGIC_NOT )    
            Vec_IntAddToEntry( vAnds, WLC_OBJ_LOGIC_NOT,        Wlc_ObjRange(Wlc_ObjFanin0(p, pObj)) - 1 );
        else if ( pObj->Type == WLC_OBJ_LOGIC_IMPL )    
            Vec_IntAddToEntry( vAnds, WLC_OBJ_LOGIC_IMPL,       Wlc_ObjRange(Wlc_ObjFanin0(p, pObj)) + Wlc_ObjRange(Wlc_ObjFanin1(p, pObj)) - 1 );
        else if ( pObj->Type == WLC_OBJ_LOGIC_AND )    
            Vec_IntAddToEntry( vAnds, WLC_OBJ_LOGIC_AND,        Wlc_ObjRange(Wlc_ObjFanin0(p, pObj)) + Wlc_ObjRange(Wlc_ObjFanin1(p, pObj)) - 1 );
        else if ( pObj->Type == WLC_OBJ_LOGIC_OR )     
            Vec_IntAddToEntry( vAnds, WLC_OBJ_LOGIC_OR,         Wlc_ObjRange(Wlc_ObjFanin0(p, pObj)) + Wlc_ObjRange(Wlc_ObjFanin1(p, pObj)) - 1 );
        else if ( pObj->Type == WLC_OBJ_LOGIC_XOR )    
            Vec_IntAddToEntry( vAnds, WLC_OBJ_LOGIC_XOR,        Wlc_ObjRange(Wlc_ObjFanin0(p, pObj)) + Wlc_ObjRange(Wlc_ObjFanin1(p, pObj)) + 1 );
        else if ( pObj->Type == WLC_OBJ_COMP_EQU )     
            Vec_IntAddToEntry( vAnds, WLC_OBJ_COMP_EQU,     4 * Wlc_ObjRange(Wlc_ObjFanin0(p, pObj)) - 1 );
        else if ( pObj->Type == WLC_OBJ_COMP_NOTEQU )  
            Vec_IntAddToEntry( vAnds, WLC_OBJ_COMP_NOTEQU,  4 * Wlc_ObjRange(Wlc_ObjFanin0(p, pObj)) - 1 );
        else if ( pObj->Type == WLC_OBJ_COMP_LESS )    
            Vec_IntAddToEntry( vAnds, WLC_OBJ_COMP_LESS,    6 * Wlc_ObjRange(Wlc_ObjFanin0(p, pObj)) - 6 );
        else if ( pObj->Type == WLC_OBJ_COMP_MORE )    
            Vec_IntAddToEntry( vAnds, WLC_OBJ_COMP_MORE,    6 * Wlc_ObjRange(Wlc_ObjFanin0(p, pObj)) - 6 );
        else if ( pObj->Type == WLC_OBJ_COMP_LESSEQU ) 
            Vec_IntAddToEntry( vAnds, WLC_OBJ_COMP_LESSEQU, 6 * Wlc_ObjRange(Wlc_ObjFanin0(p, pObj)) - 6 );
        else if ( pObj->Type == WLC_OBJ_COMP_MOREEQU ) 
            Vec_IntAddToEntry( vAnds, WLC_OBJ_COMP_MOREEQU, 6 * Wlc_ObjRange(Wlc_ObjFanin0(p, pObj)) - 6 );
        else if ( pObj->Type == WLC_OBJ_REDUCT_AND )   
            Vec_IntAddToEntry( vAnds, WLC_OBJ_REDUCT_AND,       Wlc_ObjRange(Wlc_ObjFanin0(p, pObj)) - 1 );
        else if ( pObj->Type == WLC_OBJ_REDUCT_OR )    
            Vec_IntAddToEntry( vAnds, WLC_OBJ_REDUCT_OR,        Wlc_ObjRange(Wlc_ObjFanin0(p, pObj)) - 1 );
        else if ( pObj->Type == WLC_OBJ_REDUCT_XOR )   
            Vec_IntAddToEntry( vAnds, WLC_OBJ_REDUCT_XOR,   3 * Wlc_ObjRange(Wlc_ObjFanin0(p, pObj)) - 3 );
        else if ( pObj->Type == WLC_OBJ_REDUCT_NAND )   
            Vec_IntAddToEntry( vAnds, WLC_OBJ_REDUCT_NAND,      Wlc_ObjRange(Wlc_ObjFanin0(p, pObj)) - 1 );
        else if ( pObj->Type == WLC_OBJ_REDUCT_NOR )    
            Vec_IntAddToEntry( vAnds, WLC_OBJ_REDUCT_NOR,       Wlc_ObjRange(Wlc_ObjFanin0(p, pObj)) - 1 );
        else if ( pObj->Type == WLC_OBJ_REDUCT_NXOR )   
            Vec_IntAddToEntry( vAnds, WLC_OBJ_REDUCT_NXOR,  3 * Wlc_ObjRange(Wlc_ObjFanin0(p, pObj)) - 3 );
        else if ( pObj->Type == WLC_OBJ_ARI_ADD )       
            Vec_IntAddToEntry( vAnds, WLC_OBJ_ARI_ADD,      9 * Wlc_ObjRange(Wlc_ObjFanin0(p, pObj)) );
        else if ( pObj->Type == WLC_OBJ_ARI_SUB )       
            Vec_IntAddToEntry( vAnds, WLC_OBJ_ARI_SUB,      9 * Wlc_ObjRange(Wlc_ObjFanin0(p, pObj)) );
        else if ( pObj->Type == WLC_OBJ_ARI_MULTI )    
            Vec_IntAddToEntry( vAnds, WLC_OBJ_ARI_MULTI,    9 * Wlc_ObjRange(Wlc_ObjFanin0(p, pObj)) * Wlc_ObjRange(Wlc_ObjFanin1(p, pObj)) );
        else if ( pObj->Type == WLC_OBJ_ARI_DIVIDE )   
            Vec_IntAddToEntry( vAnds, WLC_OBJ_ARI_DIVIDE,  13 * Wlc_ObjRange(Wlc_ObjFanin0(p, pObj)) * Wlc_ObjRange(Wlc_ObjFanin0(p, pObj)) - 19 * Wlc_ObjRange(Wlc_ObjFanin0(p, pObj)) + 10 );
        else if ( pObj->Type == WLC_OBJ_ARI_REM )  
            Vec_IntAddToEntry( vAnds, WLC_OBJ_ARI_REM,     13 * Wlc_ObjRange(Wlc_ObjFanin0(p, pObj)) * Wlc_ObjRange(Wlc_ObjFanin0(p, pObj)) - 7 * Wlc_ObjRange(Wlc_ObjFanin0(p, pObj)) - 2  );
        else if ( pObj->Type == WLC_OBJ_ARI_MODULUS )  
            Vec_IntAddToEntry( vAnds, WLC_OBJ_ARI_MODULUS, 13 * Wlc_ObjRange(Wlc_ObjFanin0(p, pObj)) * Wlc_ObjRange(Wlc_ObjFanin0(p, pObj)) - 7 * Wlc_ObjRange(Wlc_ObjFanin0(p, pObj)) - 2  );
        else if ( pObj->Type == WLC_OBJ_ARI_POWER ) 
            Vec_IntAddToEntry( vAnds, WLC_OBJ_ARI_POWER,   10 * (int)pow((double)Wlc_ObjRange(Wlc_ObjFanin0(p, pObj)),(double)Wlc_ObjRange(Wlc_ObjFanin0(p, pObj))) );
        else if ( pObj->Type == WLC_OBJ_ARI_MINUS )   
            Vec_IntAddToEntry( vAnds, WLC_OBJ_ARI_MINUS,    4 * Wlc_ObjRange(Wlc_ObjFanin0(p, pObj)) );
        else if ( pObj->Type == WLC_OBJ_ARI_SQRT )    
            Vec_IntAddToEntry( vAnds, WLC_OBJ_ARI_SQRT,    11 * Wlc_ObjRange(Wlc_ObjFanin0(p, pObj)) * Wlc_ObjRange(Wlc_ObjFanin0(p, pObj)) / 8 + 5 * Wlc_ObjRange(Wlc_ObjFanin0(p, pObj)) / 2 - 5  );
        else if ( pObj->Type == WLC_OBJ_ARI_SQUARE )    
            Vec_IntAddToEntry( vAnds, WLC_OBJ_ARI_SQUARE,   5 * Wlc_ObjRange(Wlc_ObjFanin0(p, pObj)) * Wlc_ObjRange(Wlc_ObjFanin1(p, pObj))  );
    }
    if ( nCountRange && Vec_IntSize(&p->vNameIds) > 0 )
    {
        printf( "Warning: %d objects of the design have non-zero-based ranges.\n", nCountRange );
        printf( "In particular, object %6d with name \"%s\" has range %d=[%d:%d]\n", Wlc_ObjId(p, pObjRange), 
            Abc_NamStr(p->pManName, Wlc_ObjNameId(p, Wlc_ObjId(p, pObjRange))), Wlc_ObjRange(pObjRange), pObjRange->End, pObjRange->Beg );
    }
    // print by occurrence
    printf( "ID  :  name  occurrence%s    and2 (occurrence)<output_range>=<input_range>.<input_range> ...\n", fTwoSides ? "     Left Share Right":"" );
    for ( i = 0; i < WLC_OBJ_NUMBER; i++ )
    {
        Vec_Wrd_t * vType  = (Vec_Wrd_t *)Vec_PtrEntry( vTypes, i );
        Vec_Wrd_t * vOccur = (Vec_Wrd_t *)Vec_PtrEntry( vOccurs, i );
        if ( p->nObjs[i] == 0 )
            continue;
        printf( "%2d  :  %-8s  %6d", i, Wlc_Names[i], p->nObjs[i] );
        if ( fTwoSides )
        {
            int nTotal = i == WLC_OBJ_PI ? Wlc_NtkCountRealPis(p) : p->nObjs[i];
            printf( "   " );
            printf( "%6d", nObjs[0][i] );
            printf( "%6d", nObjs[0][i]+nObjs[1][i]-nTotal );
            printf( "%6d", nObjs[1][i] );
        }
        printf( "%8d ", Vec_IntEntry(vAnds, i) );
        // sort by occurence
        Wlc_NtkPrintDistribSortOne( vTypes, vOccurs, i );
        Vec_WrdForEachEntry( vType, Sign, k )
        {
            Wlc_NtkPrintDistribFromSign( Sign, &s, &s0, &s1 );
            if ( ((k % 6) == 5 && s1) || ((k % 8) == 7 && !s1) )
            {
                printf( "\n                                " );
                if ( fTwoSides )
                    printf( "                     " );
            }
            printf( "(%d)", (int)Vec_WrdEntry( vOccur, k ) );
            printf( "%s%d",      Abc_LitIsCompl(s)?"-":"",  Abc_Lit2Var(s) );
            if ( s0 )
                printf( "=%s%d", Abc_LitIsCompl(s0)?"-":"", Abc_Lit2Var(s0) );
            if ( s1 )
                printf( ".%s%d", Abc_LitIsCompl(s1)?"-":"", Abc_Lit2Var(s1) );
            printf( " " );
        }
        printf( "\n" );
    }
    Vec_VecFree( (Vec_Vec_t *)vTypes );
    Vec_VecFree( (Vec_Vec_t *)vOccurs );
    Vec_IntFree( vAnds );
}